

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderTextureSizeTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureSizeCase::iterate(TextureSizeCase *this)

{
  bool bVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  size_type sVar5;
  reference pvVar6;
  MessageBuilder local_7e0;
  MessageBuilder local_660;
  MessageBuilder local_4e0;
  undefined4 local_35c;
  OutOfMemoryError *anon_var_0;
  int local_1c8 [4];
  MessageBuilder local_1b8;
  byte local_31;
  undefined1 local_30 [7];
  bool skipTest;
  Surface result;
  TextureSizeCase *this_local;
  
  result.m_pixels.m_cap = (size_t)this;
  tcu::Surface::Surface((Surface *)local_30,1,1);
  local_31 = 0;
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [12])"\nIteration ");
  local_1c8[0] = this->m_iteration + 1;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c8);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [4])0x2b9720c);
  sVar5 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::size
                    (&this->m_iterations);
  anon_var_0._4_4_ = (undefined4)sVar5;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&anon_var_0 + 4));
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  pvVar6 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::operator[]
                     (&this->m_iterations,(long)this->m_iteration);
  createTexture(this,pvVar6);
  pvVar6 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::operator[]
                     (&this->m_iterations,(long)this->m_iteration);
  runShader(this,(Surface *)local_30,pvVar6);
  deleteTexture(this);
  if ((local_31 & 1) == 0) {
    this->m_allCasesSkipped = false;
    bVar1 = verifyImage(this,(Surface *)local_30);
    if (!bVar1) {
      this->m_allIterationsPassed = false;
    }
  }
  iVar2 = this->m_iteration + 1;
  this->m_iteration = iVar2;
  sVar5 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::size
                    (&this->m_iterations);
  if (iVar2 < (int)sVar5) {
    this_local._4_4_ = CONTINUE;
  }
  else {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_4e0,(char (*) [31])"One or more test sizes failed.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid texture size");
    }
    else if ((this->m_allCasesSkipped & 1U) == 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_7e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_7e0,(char (*) [26])"All texture sizes passed.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7e0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_660,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_660,
                          (char (*) [58])"Could not test any texture size, texture creation failed."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_660);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "All test texture creations failed");
    }
    this_local._4_4_ = STOP;
  }
  local_35c = 1;
  tcu::Surface::~Surface((Surface *)local_30);
  return this_local._4_4_;
}

Assistant:

TextureSizeCase::IterateResult TextureSizeCase::iterate (void)
{
	tcu::Surface	result		(1, 1);
	bool			skipTest	= false;

	m_testCtx.getLog() << tcu::TestLog::Message << "\nIteration " << (m_iteration+1) << " / " << (int)m_iterations.size() << tcu::TestLog::EndMessage;

	try
	{
		// set texture size

		createTexture(m_iterations[m_iteration]);

		// query texture size

		runShader(result, m_iterations[m_iteration]);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY, skipping this size" << tcu::TestLog::EndMessage;

		skipTest = true;
	}

	// free resources

	deleteTexture();

	// queried value was correct?

	if (!skipTest)
	{
		m_allCasesSkipped = false;

		if (!verifyImage(result))
			m_allIterationsPassed = false;
	}

	// final result

	if (++m_iteration < (int)m_iterations.size())
		return CONTINUE;

	if (!m_allIterationsPassed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "One or more test sizes failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid texture size");
	}
	else if (m_allCasesSkipped)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Could not test any texture size, texture creation failed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "All test texture creations failed");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "All texture sizes passed." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}